

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void __thiscall ieee754::set_mbit(ieee754 *this,int n,int bit)

{
  int in_EDX;
  int in_ESI;
  ieee754 *in_RDI;
  uchar mask;
  int byteidx;
  byte local_15;
  int local_14;
  int local_10;
  
  local_10 = in_EDX;
  get_mbit_ptr(in_RDI,&local_14,&local_15,in_ESI);
  if (local_10 == 0) {
    in_RDI->buf[local_14] = in_RDI->buf[local_14] & (local_15 ^ 0xff);
  }
  else {
    in_RDI->buf[local_14] = in_RDI->buf[local_14] | local_15;
  }
  return;
}

Assistant:

void set_mbit(int n, int bit)
    {
        /* get the mantissa byte index and mask */
        int byteidx;
        unsigned char mask;
        get_mbit_ptr(byteidx, mask, n);

        /* set or clear the bit */
        if (bit)
            buf[byteidx] |= mask;
        else
            buf[byteidx] &= ~mask;
    }